

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateContextExtTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::anon_unknown_3::CreateContextExtCase::executeForSurface
          (CreateContextExtCase *this,EGLConfig config,EGLSurface surface)

{
  ostringstream *poVar1;
  EGLDisplay display;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *log;
  bool bVar2;
  bool bVar3;
  deUint32 dVar4;
  int iVar5;
  uint major;
  int iVar6;
  GLenum GVar7;
  Library *pLVar8;
  undefined4 extraout_var;
  int *piVar9;
  GLubyte *__s;
  EGLint flags;
  EGLint flags_00;
  EGLint mask;
  EGLint mask_00;
  EGLint flags_01;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  bool bVar14;
  uint uVar15;
  deInt32 contextFlagsGL;
  deInt32 strategy;
  deInt32 contextFlagsGL_1;
  string version;
  UniqueContext context;
  Functions gl;
  uint local_1c64;
  string local_1c60;
  int local_1c3c;
  Library *local_1c38;
  string local_1c30;
  long *local_1c10;
  long local_1c08;
  long local_1c00 [2];
  UniqueContext local_1bf0;
  undefined1 local_1bd8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1bc8 [6];
  ios_base local_1b60 [264];
  Functions local_1a58;
  
  pLVar8 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  (**pLVar8->_vptr_Library)(pLVar8,(ulong)this->m_api);
  dVar4 = (*pLVar8->_vptr_Library[0x1f])(pLVar8);
  eglu::checkError(dVar4,"bindAPI(m_api)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                   ,0x3b7);
  local_1c38 = pLVar8;
  glw::Functions::Functions(&local_1a58);
  display = this->m_display;
  iVar5 = (*pLVar8->_vptr_Library[6])
                    (pLVar8,display,config,0,
                     (this->m_attribList).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start);
  eglu::UniqueContext::UniqueContext
            (&local_1bf0,pLVar8,display,(EGLContext)CONCAT44(extraout_var,iVar5));
  dVar4 = (*pLVar8->_vptr_Library[0x1f])(pLVar8);
  eglu::checkError(dVar4,"eglCreateContext",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                   ,0x3bd);
  (*local_1c38->_vptr_Library[0x27])
            (local_1c38,this->m_display,surface,surface,local_1bf0.m_context);
  dVar4 = (*local_1c38->_vptr_Library[0x1f])();
  eglu::checkError(dVar4,"makeCurrent(m_display, surface, surface, *context)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                   ,0x3bf);
  EglTestContext::initGLFunctions
            ((this->super_TestCase).m_eglTestCtx,&local_1a58,
             (ApiType)((this->m_glContextType).super_ApiType.m_bits & 0x3ff));
  piVar9 = (this->m_attribList).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  log = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar5 = -1;
  uVar11 = 0xffffffff;
  uVar13 = 0xffffffff;
  uVar10 = 0xffffffff;
  local_1c3c = -1;
  uVar12 = 0xffffffff;
  uVar15 = 0xffffffff;
  do {
    while( true ) {
      while( true ) {
        while (iVar6 = *piVar9, 0x30fb < iVar6) {
          if (iVar6 < 0x3138) {
            if (iVar6 == 0x30fc) {
              uVar11 = piVar9[1];
              piVar9 = piVar9 + 2;
            }
            else if (iVar6 == 0x30fd) {
              uVar13 = piVar9[1];
              piVar9 = piVar9 + 2;
            }
          }
          else if (iVar6 == 0x3138) {
            uVar12 = piVar9[1];
            piVar9 = piVar9 + 2;
          }
          else if (iVar6 == 0x31bd) {
            uVar10 = piVar9[1];
            piVar9 = piVar9 + 2;
          }
        }
        if (iVar6 < 0x30bf) break;
        if (iVar6 == 0x30bf) {
          local_1c3c = piVar9[1];
          piVar9 = piVar9 + 2;
        }
        else if (iVar6 == 0x30fb) {
          iVar5 = piVar9[1];
          piVar9 = piVar9 + 2;
        }
      }
      if (iVar6 != 0x3098) break;
      uVar15 = piVar9[1];
      piVar9 = piVar9 + 2;
    }
  } while (iVar6 != 0x3038);
  __s = (*local_1a58.getString)(0x1f02);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c10,(char *)__s,(allocator<char> *)&local_1c60);
  local_1bd8._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1bd8 + 8));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1bd8 + 8),"GL_VERSION: \'",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1bd8 + 8),(char *)local_1c10,local_1c08);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1bd8 + 8),"\'",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1bd8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1bd8 + 8));
  std::ios_base::~ios_base(local_1b60);
  major = 1;
  if (uVar15 != 0xffffffff) {
    major = uVar15;
  }
  iVar6 = 0;
  if (iVar5 != -1) {
    iVar6 = iVar5;
  }
  if (this->m_api == 0x30a0) {
    bVar2 = checkVersionString((TestLog *)&log->_M_allocated_capacity,&local_1a58,false,major,iVar6)
    ;
    bVar14 = bVar2;
    if (major == 3) {
      bVar3 = checkVersionQueries((TestLog *)&log->_M_allocated_capacity,&local_1a58,3,iVar6);
      goto LAB_001ffcbe;
    }
  }
  else {
    bVar14 = true;
    if ((this->m_api == 0x30a2) &&
       (bVar2 = checkVersionString((TestLog *)&log->_M_allocated_capacity,&local_1a58,true,major,
                                   iVar6), bVar14 = bVar2, 2 < (int)major)) {
      bVar3 = checkVersionQueries((TestLog *)&log->_M_allocated_capacity,&local_1a58,major,iVar6);
LAB_001ffcbe:
      bVar14 = false;
      if (bVar3 != false) {
        bVar14 = bVar2;
      }
    }
  }
  if ((((uVar11 != 0xffffffff) && (this->m_api == 0x30a2)) &&
      ((3 < (int)major || ((major == 3 && (0 < iVar6)))))) &&
     ((*local_1a58.getIntegerv)(0x821e,(GLint *)&local_1c64), uVar11 != local_1c64)) {
    poVar1 = (ostringstream *)(local_1bd8 + 8);
    local_1bd8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Invalid GL_CONTEXT_FLAGS. Expected \'",0x24);
    (anonymous_namespace)::eglContextFlagsToString_abi_cxx11_
              (&local_1c60,(_anonymous_namespace_ *)(ulong)uVar11,flags);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,local_1c60._M_dataplus._M_p,local_1c60._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\' got \'",7);
    (anonymous_namespace)::eglContextFlagsToString_abi_cxx11_
              (&local_1c30,(_anonymous_namespace_ *)(ulong)local_1c64,flags_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               (char *)CONCAT44(local_1c30._M_dataplus._M_p._4_4_,(uint)local_1c30._M_dataplus._M_p)
               ,local_1c30._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\'",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1bd8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1c30._M_dataplus._M_p._4_4_,(uint)local_1c30._M_dataplus._M_p) !=
        &local_1c30.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1c30._M_dataplus._M_p._4_4_,(uint)local_1c30._M_dataplus._M_p),
                      local_1c30.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c60._M_dataplus._M_p != &local_1c60.field_2) {
      operator_delete(local_1c60._M_dataplus._M_p,local_1c60.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_1b60);
    bVar14 = false;
  }
  if ((((uVar13 != 0xffffffff) || ((this->m_api == 0x30a2 && (uVar13 = 1, 2 < (int)major)))) &&
      (2 < (int)major)) && ((major != 3 || (1 < iVar6)))) {
    local_1c64 = 0;
    (*local_1a58.getIntegerv)(0x9126,(GLint *)&local_1c64);
    GVar7 = (*local_1a58.getError)();
    glu::checkError(GVar7,"glGetIntegerv()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                    ,0x31a);
    if (uVar13 != local_1c64) {
      poVar1 = (ostringstream *)(local_1bd8 + 8);
      local_1bd8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Invalid GL_CONTEXT_PROFILE_MASK. Expected \'",0x2b);
      (anonymous_namespace)::eglProfileMaskToString_abi_cxx11_
                (&local_1c60,(_anonymous_namespace_ *)(ulong)uVar13,mask);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,local_1c60._M_dataplus._M_p,local_1c60._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\' got \'",7);
      (anonymous_namespace)::eglProfileMaskToString_abi_cxx11_
                (&local_1c30,(_anonymous_namespace_ *)(ulong)local_1c64,mask_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 (char *)CONCAT44(local_1c30._M_dataplus._M_p._4_4_,
                                  (uint)local_1c30._M_dataplus._M_p),local_1c30._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\'",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1bd8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1c30._M_dataplus._M_p._4_4_,(uint)local_1c30._M_dataplus._M_p) !=
          &local_1c30.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1c30._M_dataplus._M_p._4_4_,(uint)local_1c30._M_dataplus._M_p
                                ),local_1c30.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c60._M_dataplus._M_p != &local_1c60.field_2) {
        operator_delete(local_1c60._M_dataplus._M_p,local_1c60.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_1b60);
      bVar14 = false;
    }
  }
  if ((uVar10 & uVar12) != 0xffffffff) {
    if (uVar10 != 0xffffffff) {
      uVar12 = uVar10;
    }
    local_1c60._M_dataplus._M_p = local_1c60._M_dataplus._M_p & 0xffffffff00000000;
    (*local_1a58.getIntegerv)(0x8256,(GLint *)&local_1c60);
    GVar7 = (*local_1a58.getError)();
    glu::checkError(GVar7,"glGetIntegerv()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                    ,0x32c);
    if ((int)local_1c60._M_dataplus._M_p == 0x8261 || uVar12 != 0x31be) {
      if ((int)local_1c60._M_dataplus._M_p == 0x8252 || uVar12 != 0x31bf) goto LAB_00200105;
      poVar1 = (ostringstream *)(local_1bd8 + 8);
      local_1bd8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"glGetIntegerv(GL_RESET_NOTIFICATION_STRATEGY) returned \'",0x38)
      ;
      std::ostream::operator<<(poVar1,(int)local_1c60._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"\', expected \'GL_LOSE_CONTEXT_ON_RESET\'",0x26);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1bd8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      poVar1 = (ostringstream *)(local_1bd8 + 8);
      local_1bd8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"glGetIntegerv(GL_RESET_NOTIFICATION_STRATEGY) returned \'",0x38)
      ;
      std::ostream::operator<<(poVar1,(int)local_1c60._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"\', expected \'GL_NO_RESET_NOTIFICATION\'",0x26);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1bd8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1bd8 + 8));
    std::ios_base::~ios_base(local_1b60);
    bVar14 = false;
  }
LAB_00200105:
  if (local_1c3c != 1) goto LAB_002004c5;
  if (this->m_api == 0x30a0) {
    local_1c60._M_dataplus._M_p = (char *)0x11;
    local_1bd8._0_8_ = local_1bc8;
    local_1bd8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1bd8,(ulong)&local_1c60);
    local_1bc8[0]._M_allocated_capacity = local_1c60._M_dataplus._M_p;
    *(undefined8 *)local_1bd8._0_8_ = 0x725f5458455f4c47;
    ((TestLog *)(local_1bd8._0_8_ + 8))->m_log = (qpTestLog *)0x73656e747375626f;
    *(char *)&((TestLog *)(local_1bd8._0_8_ + 0x10))->m_log = 's';
    local_1bd8._8_8_ = local_1c60._M_dataplus._M_p;
    local_1c60._M_dataplus._M_p[local_1bd8._0_8_] = '\0';
    bVar2 = glu::hasExtension(&local_1a58,(ApiType)(iVar6 << 4 | major),(string *)local_1bd8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1bd8._0_8_ != local_1bc8) {
      operator_delete((void *)local_1bd8._0_8_,(ulong)(local_1bc8[0]._M_allocated_capacity + 1));
    }
    if (!bVar2) {
      local_1bd8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1bd8 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1bd8 + 8),
                 "Created robustness context but it doesn\'t support GL_EXT_robustness.",0x44);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1bd8,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_002002e6:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1bd8 + 8));
      std::ios_base::~ios_base(local_1b60);
      bVar14 = false;
    }
  }
  else if (this->m_api == 0x30a2) {
    local_1c60._M_dataplus._M_p = (char *)0x11;
    local_1bd8._0_8_ = local_1bc8;
    local_1bd8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1bd8,(ulong)&local_1c60);
    local_1bc8[0]._M_allocated_capacity = local_1c60._M_dataplus._M_p;
    *(undefined8 *)local_1bd8._0_8_ = 0x725f4252415f4c47;
    ((TestLog *)(local_1bd8._0_8_ + 8))->m_log = (qpTestLog *)0x73656e747375626f;
    *(char *)&((TestLog *)(local_1bd8._0_8_ + 0x10))->m_log = 's';
    local_1bd8._8_8_ = local_1c60._M_dataplus._M_p;
    local_1c60._M_dataplus._M_p[local_1bd8._0_8_] = '\0';
    bVar2 = glu::hasExtension(&local_1a58,(ApiType)(iVar6 << 4 | major | 0x100),(string *)local_1bd8
                             );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1bd8._0_8_ != local_1bc8) {
      operator_delete((void *)local_1bd8._0_8_,(ulong)(local_1bc8[0]._M_allocated_capacity + 1));
    }
    if (!bVar2) {
      local_1bd8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1bd8 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1bd8 + 8),
                 "Created robustness context but it doesn\'t support GL_ARB_robustness.",0x44);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1bd8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_002002e6;
    }
  }
  if (this->m_api == 0x30a0) {
    (*local_1a58.getBooleanv)(0x90f3,(GLboolean *)&local_1c30);
    GVar7 = (*local_1a58.getError)();
    glu::checkError(GVar7,"glGetBooleanv()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                    ,0x360);
    if ((char)local_1c30._M_dataplus._M_p == '\x01') goto LAB_002004c5;
    poVar1 = (ostringstream *)(local_1bd8 + 8);
    local_1bd8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Invalid GL_CONTEXT_ROBUST_ACCESS returned by glGetBooleanv(). Got \'",0x43);
    local_1c60._M_dataplus._M_p._0_1_ = (char)local_1c30._M_dataplus._M_p;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_1c60,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"\' expected GL_TRUE.",0x13);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1bd8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    if (((this->m_api != 0x30a2) || (((int)major < 4 && ((major != 3 || (iVar6 < 1)))))) ||
       ((*local_1a58.getIntegerv)(0x821e,(GLint *)&local_1c30),
       ((uint)local_1c30._M_dataplus._M_p & 4) == 0)) goto LAB_002004c5;
    poVar1 = (ostringstream *)(local_1bd8 + 8);
    local_1bd8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Invalid GL_CONTEXT_FLAGS. GL_CONTEXT_FLAG_ROBUST_ACCESS_BIT to be set, got \'",0x4c)
    ;
    (anonymous_namespace)::eglContextFlagsToString_abi_cxx11_
              (&local_1c60,(_anonymous_namespace_ *)(ulong)(uint)local_1c30._M_dataplus._M_p,
               flags_01);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,local_1c60._M_dataplus._M_p,local_1c60._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\'",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1bd8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c60._M_dataplus._M_p != &local_1c60.field_2) {
      operator_delete(local_1c60._M_dataplus._M_p,local_1c60.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1bd8 + 8));
  std::ios_base::~ios_base(local_1b60);
  bVar14 = false;
LAB_002004c5:
  if (local_1c10 != local_1c00) {
    operator_delete(local_1c10,local_1c00[0] + 1);
  }
  if (bVar14 == false) {
    this->m_isOk = false;
  }
  eglu::UniqueContext::~UniqueContext(&local_1bf0);
  pLVar8 = local_1c38;
  (*local_1c38->_vptr_Library[0x27])(local_1c38,this->m_display,0,0,0);
  dVar4 = (*pLVar8->_vptr_Library[0x1f])(pLVar8);
  eglu::checkError(dVar4,"makeCurrent(m_display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                   ,0x3d3);
  return;
}

Assistant:

void CreateContextExtCase::executeForSurface (EGLConfig config, EGLSurface surface)
{
	const Library&	egl		= m_eglTestCtx.getLibrary();

	EGLU_CHECK_CALL(egl, bindAPI(m_api));

	try
	{
		glw::Functions		gl;
		eglu::UniqueContext	context	(egl, m_display, egl.createContext(m_display, config, EGL_NO_CONTEXT, &m_attribList[0]));
		EGLU_CHECK_MSG(egl, "eglCreateContext");

		EGLU_CHECK_CALL(egl, makeCurrent(m_display, surface, surface, *context));

		m_eglTestCtx.initGLFunctions(&gl, m_glContextType.getAPI());

		if (!validateCurrentContext(gl))
			m_isOk = false;
	}
	catch (const eglu::Error& error)
	{
		if (error.getError() == EGL_BAD_MATCH)
			m_testCtx.getLog() << TestLog::Message << "Context creation failed with error EGL_BAD_CONTEXT. Config doesn't support api version." << TestLog::EndMessage;
		else if (error.getError() == EGL_BAD_CONFIG)
			m_testCtx.getLog() << TestLog::Message << "Context creation failed with error EGL_BAD_MATCH. Context attribute compination not supported." << TestLog::EndMessage;
		else
		{
			m_testCtx.getLog() << TestLog::Message << "Context creation failed with error " << eglu::getErrorStr(error.getError()) << ". Error is not result of unsupported api etc." << TestLog::EndMessage;
			m_isOk = false;
		}
	}

	EGLU_CHECK_CALL(egl, makeCurrent(m_display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
}